

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O0

bool __thiscall CommandLineParser::argumentStartsWith(CommandLineParser *this,string *expected)

{
  __type _Var1;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *expected_local;
  CommandLineParser *this_local;
  
  local_18 = expected;
  expected_local = (string *)this;
  getCurrentArgument_abi_cxx11_(&local_58,this);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&local_38,(ulong)&local_58);
  _Var1 = std::operator==(&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return _Var1;
}

Assistant:

bool 
CommandLineParser::argumentStartsWith( const std::string &expected ) const
{
  return getCurrentArgument().substr( 0, expected.length() ) == expected;
}